

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclConfig.cpp
# Opt level: O2

void __thiscall xmrig::OclConfig::setDevicesHint(OclConfig *this,char *devicesHint)

{
  ulong uVar1;
  String *index;
  pointer pSVar2;
  String local_50;
  vector<xmrig::String,_std::allocator<xmrig::String>_> indexes;
  
  if (devicesHint != (char *)0x0) {
    String::String(&local_50,devicesHint);
    String::split(&indexes,&local_50,',');
    String::~String(&local_50);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_devicesHint,
               (long)indexes.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)indexes.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 4);
    for (pSVar2 = indexes.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar2 != indexes.super__Vector_base<xmrig::String,_std::allocator<xmrig::String>_>._M_impl.
                  super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
      uVar1 = strtoul(pSVar2->m_data,(char **)0x0,10);
      local_50.m_data._0_4_ = (undefined4)uVar1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->m_devicesHint,(uint *)&local_50);
    }
    std::vector<xmrig::String,_std::allocator<xmrig::String>_>::~vector(&indexes);
  }
  return;
}

Assistant:

void xmrig::OclConfig::setDevicesHint(const char *devicesHint)
{
    if (devicesHint == nullptr) {
        return;
    }

    const auto indexes = String(devicesHint).split(',');
    m_devicesHint.reserve(indexes.size());

    for (const auto &index : indexes) {
        m_devicesHint.push_back(strtoul(index, nullptr, 10));
    }
}